

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

int rlGetLocationAttrib(uint shaderId,char *attribName)

{
  uint uVar1;
  
  uVar1 = (*glad_glGetAttribLocation)(shaderId,attribName);
  if (uVar1 == 0xffffffff) {
    TraceLog(4,"SHADER: [ID %i] Failed to find shader attribute: %s",shaderId,attribName);
  }
  else {
    TraceLog(3,"SHADER: [ID %i] Shader attribute (%s) set at location: %i",shaderId,attribName,
             (ulong)uVar1);
  }
  return uVar1;
}

Assistant:

int rlGetLocationAttrib(unsigned int shaderId, const char *attribName)
{
    int location = -1;
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    location = glGetAttribLocation(shaderId, attribName);

    if (location == -1) TRACELOG(LOG_WARNING, "SHADER: [ID %i] Failed to find shader attribute: %s", shaderId, attribName);
    else TRACELOG(LOG_INFO, "SHADER: [ID %i] Shader attribute (%s) set at location: %i", shaderId, attribName, location);
#endif
    return location;
}